

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_log(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  int iVar2;
  int iVar3;
  ggml_type gVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  char cVar14;
  ushort uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong in_RCX;
  char *pcVar20;
  long lVar21;
  long lVar22;
  undefined8 uVar23;
  ggml_tensor *pgVar24;
  uint uVar25;
  ggml_tensor *pgVar26;
  ulong uVar27;
  long in_R9;
  ulong uVar28;
  int64_t ir;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  anon_union_4_2_947300a4 u;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auStack_200 [64];
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  ggml_tensor *pgStack_a0;
  undefined1 extraout_var [60];
  
  pgVar24 = dst->src[0];
  gVar1 = pgVar24->type;
  if ((gVar1 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_001311f5;
      if (pgVar24->nb[0] == 4) {
        lVar22 = pgVar24->ne[1];
        lVar19 = pgVar24->ne[2];
        sVar5 = pgVar24->nb[1];
        sVar6 = pgVar24->nb[2];
        sVar7 = pgVar24->nb[3];
        lVar8 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar2 = params->ith;
        iVar3 = params->nth;
        lVar17 = ggml_nrows(pgVar24);
        lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
        lVar29 = iVar2 * lVar18;
        lVar18 = lVar18 + lVar29;
        if (lVar17 <= lVar18) {
          lVar18 = lVar17;
        }
        if (lVar18 <= lVar29) {
          return;
        }
        lVar19 = lVar19 * lVar22;
        do {
          lVar17 = lVar29 / lVar19;
          lVar21 = lVar29 % lVar19;
          lVar31 = lVar21 / lVar22;
          lVar21 = lVar21 % lVar22;
          if (0 < lVar8) {
            pvVar9 = dst->data;
            pvVar13 = pgVar24->data;
            lVar30 = 0;
            do {
              fVar34 = logf(*(float *)((long)pvVar13 +
                                      lVar30 * 4 + lVar31 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                           );
              *(float *)((long)pvVar9 +
                        lVar30 * 4 + lVar31 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) = fVar34;
              lVar30 = lVar30 + 1;
            } while (lVar8 != lVar30);
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != lVar18);
        return;
      }
LAB_00131211:
      pcVar20 = "nb00 == sizeof(src0_t)";
      uVar23 = 0x56;
      goto LAB_0013122b;
    }
  }
  else if ((gVar1 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar24->nb[0] == 2) {
          lVar22 = pgVar24->ne[1];
          lVar19 = pgVar24->ne[2];
          sVar5 = pgVar24->nb[1];
          sVar6 = pgVar24->nb[2];
          sVar7 = pgVar24->nb[3];
          lVar8 = dst->ne[0];
          iVar2 = params->ith;
          iVar3 = params->nth;
          lVar17 = ggml_nrows(pgVar24);
          lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
          lVar29 = iVar2 * lVar18;
          lVar18 = lVar18 + lVar29;
          if (lVar17 <= lVar18) {
            lVar18 = lVar17;
          }
          if (lVar18 <= lVar29) {
            return;
          }
          lVar19 = lVar19 * lVar22;
          do {
            lVar17 = lVar29 % lVar19;
            if (0 < lVar8) {
              pvVar9 = pgVar24->data;
              lVar31 = 0;
              do {
                auVar38._0_4_ =
                     logf(*(float *)(&ggml_table_f32_f16 +
                                    (ulong)*(ushort *)
                                            ((long)pvVar9 +
                                            lVar31 * 2 +
                                            (lVar17 / lVar22) * sVar6 +
                                            (lVar17 % lVar22) * sVar5 + (lVar29 / lVar19) * sVar7) *
                                    4));
                auVar38._4_60_ = extraout_var;
                auVar35 = vcvtps2ph_f16c(auVar38._0_16_,0);
                vpextrw_avx(auVar35,0);
                lVar31 = lVar31 + 1;
              } while (lVar8 != lVar31);
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != lVar18);
          return;
        }
        goto LAB_00131211;
      }
      goto LAB_001311f5;
    }
  }
  else if (gVar1 == GGML_TYPE_BF16) {
    gVar4 = dst->type;
    in_RCX = (ulong)gVar4;
    if (gVar4 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(pgVar24);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar24->nb[0] == 2) {
            lVar22 = pgVar24->ne[1];
            lVar19 = pgVar24->ne[2];
            sVar5 = pgVar24->nb[1];
            sVar6 = pgVar24->nb[2];
            sVar7 = pgVar24->nb[3];
            lVar8 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar2 = params->ith;
            iVar3 = params->nth;
            lVar17 = ggml_nrows(pgVar24);
            lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
            lVar29 = iVar2 * lVar18;
            lVar18 = lVar18 + lVar29;
            if (lVar17 <= lVar18) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar29) {
              return;
            }
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar29 / lVar19;
              lVar21 = lVar29 % lVar19;
              lVar31 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar30 = 0;
                do {
                  fVar34 = logf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar30 * 2 +
                                               lVar31 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7) <<
                                       0x10));
                  *(float *)((long)pvVar9 +
                            lVar30 * 4 + lVar31 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                       fVar34;
                  lVar30 = lVar30 + 1;
                } while (lVar8 != lVar30);
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != lVar18);
            return;
          }
          goto LAB_00131211;
        }
        goto LAB_001311f5;
      }
    }
    else {
      if (gVar4 != GGML_TYPE_BF16) goto LAB_00130d4a;
      cVar14 = ggml_is_contiguous_1(pgVar24);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar24->nb[0] == 2) {
            lVar22 = pgVar24->ne[1];
            lVar19 = pgVar24->ne[2];
            sVar5 = pgVar24->nb[1];
            sVar6 = pgVar24->nb[2];
            sVar7 = pgVar24->nb[3];
            lVar8 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar2 = params->ith;
            iVar3 = params->nth;
            lVar17 = ggml_nrows(pgVar24);
            lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
            lVar29 = iVar2 * lVar18;
            lVar18 = lVar18 + lVar29;
            if (lVar17 <= lVar18) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar29) {
              return;
            }
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar29 / lVar19;
              lVar21 = lVar29 % lVar19;
              lVar31 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar30 = 0;
                do {
                  fVar34 = logf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar30 * 2 +
                                               lVar31 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7) <<
                                       0x10));
                  if ((uint)ABS(fVar34) < 0x7f800001) {
                    uVar15 = (ushort)((int)fVar34 + 0x7fff + ((uint)fVar34 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar15 = (ushort)((uint)fVar34 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar9 + lVar30 * 2 + lVar31 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12)
                       = uVar15;
                  lVar30 = lVar30 + 1;
                } while (lVar8 != lVar30);
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != lVar18);
            return;
          }
          goto LAB_00131211;
        }
        goto LAB_001311f5;
      }
    }
  }
  else {
LAB_00130d4a:
    if ((gVar1 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      pgVar26 = dst;
      ggml_compute_forward_log_cold_1();
      pgStack_a0 = dst;
      uVar25 = (uint)pgVar26;
      uVar16 = uVar25 & 0xffffffc0;
      uStack_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      uStack_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      uStack_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      uStack_1a8 = 0;
      uStack_1a0 = 0;
      uStack_198 = 0;
      uStack_190 = 0;
      uStack_188 = 0;
      auStack_200 = ZEXT1664(ZEXT816(0));
      if (0 < (int)uVar16) {
        uVar27 = 0;
        lVar22 = in_R9;
        uVar28 = in_RCX;
        do {
          lVar19 = 0;
          do {
            auVar33 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(lVar22 + lVar19),
                                          *(undefined1 (*) [64])(uVar28 + lVar19),
                                          *(undefined1 (*) [64])(auStack_200 + lVar19));
            *(undefined1 (*) [64])(auStack_200 + lVar19) = auVar33;
            lVar19 = lVar19 + 0x40;
          } while (lVar19 != 0x100);
          uVar27 = uVar27 + 0x40;
          lVar22 = lVar22 + 0x100;
          uVar28 = uVar28 + 0x100;
        } while (uVar27 < uVar16);
      }
      lVar22 = 0;
      do {
        auVar33 = vaddps_avx512f(*(undefined1 (*) [64])(auStack_200 + lVar22),
                                 *(undefined1 (*) [64])((long)&uStack_180 + lVar22));
        *(undefined1 (*) [64])(auStack_200 + lVar22) = auVar33;
        lVar22 = lVar22 + 0x40;
      } while (lVar22 == 0x40);
      auVar33._8_8_ = uStack_1b8;
      auVar33._0_8_ = uStack_1c0;
      auVar33._16_8_ = uStack_1b0;
      auVar33._24_8_ = uStack_1a8;
      auVar33._32_8_ = uStack_1a0;
      auVar33._40_8_ = uStack_198;
      auVar33._48_8_ = uStack_190;
      auVar33._56_8_ = uStack_188;
      auVar33 = vaddps_avx512f(auStack_200,auVar33);
      auVar32 = vextractf64x4_avx512f(auVar33,1);
      auVar33 = vaddps_avx512f(auVar33,ZEXT3264(auVar32));
      auVar36._0_4_ = auVar33._0_4_ + auVar33._16_4_;
      auVar36._4_4_ = auVar33._4_4_ + auVar33._20_4_;
      auVar36._8_4_ = auVar33._8_4_ + auVar33._24_4_;
      auVar36._12_4_ = auVar33._12_4_ + auVar33._28_4_;
      auVar35 = vshufpd_avx(auVar36,auVar36,1);
      auVar37._0_4_ = auVar36._0_4_ + auVar35._0_4_;
      auVar37._4_4_ = auVar36._4_4_ + auVar35._4_4_;
      auVar37._8_4_ = auVar36._8_4_ + auVar35._8_4_;
      auVar37._12_4_ = auVar36._12_4_ + auVar35._12_4_;
      auVar35 = vhaddps_avx(auVar37,auVar37);
      auVar33 = ZEXT1664(auVar35);
      if (uVar16 != uVar25) {
        lVar22 = (long)(int)uVar16;
        do {
          auVar35 = vfmadd231ss_fma(auVar33._0_16_,ZEXT416(*(uint *)(in_RCX + lVar22 * 4)),
                                    ZEXT416(*(uint *)(in_R9 + lVar22 * 4)));
          auVar33 = ZEXT1664(auVar35);
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)uVar25);
      }
      pgVar24->type = auVar33._0_4_;
      return;
    }
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar24->nb[0] == 2) {
          lVar22 = pgVar24->ne[1];
          lVar19 = pgVar24->ne[2];
          sVar5 = pgVar24->nb[1];
          sVar6 = pgVar24->nb[2];
          sVar7 = pgVar24->nb[3];
          lVar8 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar2 = params->ith;
          iVar3 = params->nth;
          lVar17 = ggml_nrows(pgVar24);
          lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
          lVar29 = iVar2 * lVar18;
          lVar18 = lVar18 + lVar29;
          if (lVar17 <= lVar18) {
            lVar18 = lVar17;
          }
          if (lVar29 < lVar18) {
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar29 / lVar19;
              lVar21 = lVar29 % lVar19;
              lVar31 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar30 = 0;
                do {
                  fVar34 = logf(*(float *)(&ggml_table_f32_f16 +
                                          (ulong)*(ushort *)
                                                  ((long)pvVar13 +
                                                  lVar30 * 2 +
                                                  lVar31 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                                          * 4));
                  *(float *)((long)pvVar9 +
                            lVar30 * 4 + lVar31 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                       fVar34;
                  lVar30 = lVar30 + 1;
                } while (lVar8 != lVar30);
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != lVar18);
          }
          return;
        }
        goto LAB_00131211;
      }
LAB_001311f5:
      pcVar20 = "nb0 == sizeof(dst_t)";
      uVar23 = 0x55;
      goto LAB_0013122b;
    }
  }
  pcVar20 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar23 = 0x51;
LAB_0013122b:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar23,"GGML_ASSERT(%s) failed",pcVar20);
}

Assistant:

void ggml_compute_forward_log(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_log>(params, dst);
}